

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  secp256k1_fe *a_00;
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uchar *tweak32;
  ulong uVar13;
  uchar *b32;
  secp256k1_ge *psVar14;
  ulong uVar15;
  secp256k1_fe *psVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  int aiStack_a0 [2];
  secp256k1_scalar *psStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined1 auStack_70 [16];
  undefined1 auStack_60 [16];
  secp256k1_ge *psStack_48;
  
  bVar17 = 0;
  secp256k1_ge_verify(a);
  psVar14 = r;
  for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
    (psVar14->x).n[0] = (a->x).n[0];
    a = (secp256k1_ge *)((long)a + (ulong)bVar17 * -0x10 + 8);
    psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar17 * -0x10 + 8);
  }
  a_00 = &r->y;
  secp256k1_fe_verify(a_00);
  uVar1 = (r->y).n[4];
  uVar12 = (uVar1 >> 0x30) * 0x1000003d1 + (r->y).n[0];
  uVar10 = (uVar12 >> 0x34) + (r->y).n[1];
  uVar13 = (uVar10 >> 0x34) + (r->y).n[2];
  uVar15 = (uVar13 >> 0x34) + (r->y).n[3];
  b32 = (uchar *)(uVar13 & 0xfffffffffffff);
  (r->y).n[0] = uVar12 & 0xfffffffffffff;
  (r->y).n[1] = uVar10 & 0xfffffffffffff;
  (r->y).n[2] = (uint64_t)b32;
  (r->y).n[3] = uVar15 & 0xfffffffffffff;
  (r->y).n[4] = (uVar15 >> 0x34) + (uVar1 & 0xffffffffffff);
  (r->y).magnitude = 1;
  secp256k1_fe_verify(a_00);
  psVar16 = a_00;
  secp256k1_fe_verify(a_00);
  if (1 < (r->y).magnitude) {
    secp256k1_ge_neg_cold_1();
    psStack_48 = r;
    if (psVar16 == (secp256k1_fe *)0x0) {
      secp256k1_ec_seckey_tweak_add_cold_3();
    }
    else if (b32 != (uchar *)0x0) {
      if (tweak32 == (uchar *)0x0) {
        secp256k1_ec_seckey_tweak_add_cold_1();
        return;
      }
      secp256k1_scalar_set_b32((secp256k1_scalar *)auStack_70,b32,aiStack_a0);
      uVar5 = auStack_70._0_8_;
      uVar6 = auStack_70._8_8_;
      uVar7 = auStack_60._0_8_;
      uVar8 = auStack_60._8_8_;
      uVar9 = secp256k1_ec_seckey_tweak_add_helper((secp256k1_scalar *)auStack_70,tweak32);
      if ((uVar6 == 0 && uVar8 == 0) && (uVar5 == 0 && uVar7 == 0)) {
        uVar9 = 0;
      }
      if (aiStack_a0[0] != 0) {
        uVar9 = 0;
      }
      aiStack_a0[0] = 0x4d430005;
      aiStack_a0[1] = 0;
      uStack_90 = 0x20;
      uStack_88 = 0;
      uStack_80 = 0;
      uStack_78 = 0;
      lVar11 = (long)(int)(uVar9 ^ 1) + -1;
      auVar18._8_4_ = (int)lVar11;
      auVar18._0_8_ = lVar11;
      auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auStack_70 = auStack_70 & auVar18;
      auStack_60 = auVar18 & auStack_60;
      psStack_98 = (secp256k1_scalar *)auStack_70;
      secp256k1_scalar_get_b32(b32,(secp256k1_scalar *)auStack_70);
      return;
    }
    secp256k1_ec_seckey_tweak_add_cold_2();
    return;
  }
  uVar2 = (r->y).n[1];
  uVar3 = (r->y).n[2];
  uVar4 = (r->y).n[3];
  (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
  (r->y).n[1] = 0x3ffffffffffffc - uVar2;
  (r->y).n[2] = 0x3ffffffffffffc - uVar3;
  (r->y).n[3] = 0x3ffffffffffffc - uVar4;
  (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
  (r->y).magnitude = 2;
  (r->y).normalized = 0;
  secp256k1_fe_verify(a_00);
  secp256k1_ge_verify(r);
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    secp256k1_ge_verify(a);
    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
    secp256k1_ge_verify(r);
}